

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  char **ppcVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  char cVar5;
  _Bool _Var6;
  ushort uVar7;
  CURLUcode CVar8;
  int iVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  uchar *ch;
  size_t sVar12;
  size_t sVar13;
  connectdata *conn;
  ssl_backend_data *psVar14;
  undefined1 *puVar15;
  char *pcVar16;
  CURLU *u;
  size_t sVar17;
  Curl_handler *pCVar18;
  ulong ulnum;
  long lVar19;
  connectbundle *bundle;
  connectdata *pcVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uchar *ch_1;
  char *pcVar26;
  proxy_info *ppVar27;
  char *pcVar28;
  uint uVar29;
  urlpieces *puVar30;
  curltime cVar31;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *conn_temp;
  char *newurl;
  char *local_100;
  _Bool local_f2;
  _Bool local_f1;
  urlpieces *local_f0;
  proxy_info *local_e8;
  char **local_e0;
  size_t local_d8;
  _Bool *local_d0;
  size_t local_c8;
  connectdata *local_c0;
  urlpieces local_b8 [2];
  
  conn = (connectdata *)0x0;
  *asyncp = false;
  Curl_free_request_state(data);
  memset(&(data->req).bytecount,0,0xd0);
  *(undefined4 *)&(data->req).size = 0xffffffff;
  *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
  *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
  *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
  local_c0 = (connectdata *)0x0;
  local_f1 = false;
  local_f2 = false;
  sVar12 = Curl_multi_max_host_connections(data->multi);
  sVar13 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  CVar11 = CURLE_URL_MALFORMAT;
  CVar10 = CVar11;
  if ((data->state).url == (char *)0x0) goto switchD_0053954b_caseD_1;
  local_d8 = sVar12;
  local_c8 = sVar13;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x588);
  if (conn == (connectdata *)0x0) {
LAB_005395c4:
    conn = (connectdata *)0x0;
  }
  else {
    sVar12 = Curl_ssl->sizeof_ssl_backend_data;
    local_d0 = protocol_done;
    psVar14 = (ssl_backend_data *)(*Curl_ccalloc)(1,sVar12 * 4);
    if (psVar14 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(conn);
      goto LAB_005395c4;
    }
    conn->ssl_extra = psVar14;
    conn->ssl[0].backend = psVar14;
    psVar14 = (ssl_backend_data *)((long)&psVar14->logger + sVar12);
    conn->ssl[1].backend = psVar14;
    psVar14 = (ssl_backend_data *)((long)&psVar14->logger + sVar12);
    conn->proxy_ssl[0].backend = psVar14;
    conn->proxy_ssl[1].backend = (ssl_backend_data *)((long)&psVar14->logger + sVar12);
    conn->handler = &Curl_handler_dummy;
    conn->connection_id = -1;
    conn->port = -1;
    conn->remote_port = -1;
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    Curl_conncontrol(conn,1);
    cVar31 = Curl_now();
    (conn->created).tv_sec = cVar31.tv_sec;
    (conn->created).tv_usec = cVar31.tv_usec;
    cVar31 = Curl_now();
    (conn->keepalive).tv_sec = cVar31.tv_sec;
    (conn->keepalive).tv_usec = cVar31.tv_usec;
    bVar23 = (data->set).proxytype;
    (conn->http_proxy).proxytype = bVar23;
    (conn->socks_proxy).proxytype = '\x04';
    pcVar16 = (data->set).str[0x15];
    if ((pcVar16 == (char *)0x0) || (*pcVar16 == '\0')) {
      uVar24 = *(uint *)&(conn->bits).field_0x4 & 0xffffffde;
      uVar29 = 0;
    }
    else {
      uVar24 = (*(uint *)&(conn->bits).field_0x4 & 0xffffffde) + (uint)(bVar23 < 3) + 0x20;
      uVar29 = (uint)(bVar23 >= 3) * 2;
    }
    puVar15 = &(conn->bits).field_0x4;
    uVar29 = uVar24 & 0xfffffffd | uVar29;
    *(uint *)puVar15 = uVar29;
    pcVar16 = (data->set).str[0x16];
    if ((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) {
      uVar29 = uVar24 | 0x22;
      *(uint *)puVar15 = uVar29;
    }
    uVar29 = (uVar29 & 0xfffffffb) + (uint)((data->state).aptr.proxyuser != (char *)0x0) * 4;
    *(uint *)&(conn->bits).field_0x4 = uVar29;
    uVar24 = *(uint *)&(data->set).field_0x8e2 >> 3 & 8;
    *(uint *)&(conn->bits).field_0x4 = uVar29 & 0xfffffff7 | uVar24;
    uVar25 = (*(uint *)&(data->set).field_0x8e2 & 0x800) << 7;
    *(uint *)&(conn->bits).field_0x4 = uVar29 & 0xfffbfff7 | uVar24 | uVar25;
    *(uint *)&(conn->bits).field_0x4 =
         uVar29 & 0xfff3fff7 | uVar24 | uVar25 | (*(uint *)&(data->set).field_0x8e2 & 0x1000) << 7;
    bVar21 = (data->set).ssl.primary.field_0x71 & 4;
    bVar23 = (conn->ssl_config).field_0x71;
    bVar2 = (conn->proxy_ssl_config).field_0x71;
    (conn->ssl_config).field_0x71 = bVar23 & 0xfb | bVar21;
    bVar22 = (data->set).ssl.primary.field_0x71 & 1;
    (conn->ssl_config).field_0x71 = bVar23 & 0xfa | bVar21 | bVar22;
    (conn->ssl_config).field_0x71 =
         bVar23 & 0xf8 | bVar21 | bVar22 | (data->set).ssl.primary.field_0x71 & 2;
    (conn->ssl_config).ssl_options = (data->set).ssl.primary.ssl_options;
    bVar23 = (data->set).proxy_ssl.primary.field_0x71 & 4;
    (conn->proxy_ssl_config).field_0x71 = bVar2 & 0xfb | bVar23;
    bVar21 = (data->set).proxy_ssl.primary.field_0x71 & 1;
    (conn->proxy_ssl_config).field_0x71 = bVar2 & 0xfa | bVar23 | bVar21;
    (conn->proxy_ssl_config).field_0x71 =
         bVar2 & 0xf8 | bVar23 | bVar21 | (data->set).proxy_ssl.primary.field_0x71 & 2;
    (conn->proxy_ssl_config).ssl_options = (data->set).proxy_ssl.primary.ssl_options;
    conn->ip_version = (data->set).ipver;
    conn->connect_only = (data->set).connect_only;
    conn->transport = '\x03';
    Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
    pcVar16 = (data->set).str[8];
    if (pcVar16 != (char *)0x0) {
      pcVar16 = (*Curl_cstrdup)(pcVar16);
      conn->localdev = pcVar16;
      if (pcVar16 == (char *)0x0) {
        Curl_llist_destroy(&conn->easyq,(void *)0x0);
        (*Curl_cfree)(conn->localdev);
        (*Curl_cfree)(conn->ssl_extra);
        (*Curl_cfree)(conn);
        goto LAB_005395c4;
      }
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    pvVar3 = (data->set).closesocket_client;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = pvVar3;
    cVar31 = Curl_now();
    (conn->lastused).tv_sec = cVar31.tv_sec;
    (conn->lastused).tv_usec = cVar31.tv_usec;
    if ((data->set).uh == (CURLU *)0x0) {
      up_free(data);
LAB_00539467:
      bVar4 = false;
      u = curl_url();
    }
    else {
      bVar23 = (data->state).field_0x6d0;
      up_free(data);
      if ((bVar23 & 2) != 0) goto LAB_00539467;
      u = curl_url_dup((data->set).uh);
      bVar4 = true;
    }
    (data->state).uh = u;
    if (u == (CURLU *)0x0) goto switchD_0053954b_caseD_7;
    if (((data->set).str[7] != (char *)0x0) &&
       (sVar12 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar12 == 0)) {
      pcVar16 = curl_maprintf("%s://%s",(data->set).str[7],(data->state).url);
      if (pcVar16 == (char *)0x0) goto switchD_0053954b_caseD_7;
      uVar29 = *(uint *)&(data->state).field_0x6d0;
      if ((uVar29 >> 0x11 & 1) != 0) {
        (*Curl_cfree)((data->state).url);
        uVar29 = *(uint *)&(data->state).field_0x6d0;
      }
      (data->state).url = pcVar16;
      *(uint *)&(data->state).field_0x6d0 = uVar29 | 0x20000;
    }
    if (!bVar4) {
      uVar29 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x20);
      CVar8 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                           (uVar29 >> 0xb & 0x20) + (uVar29 >> 5 & 0x10) + 0x208);
      CVar10 = CURLE_URL_MALFORMAT;
      switch(CVar8) {
      case CURLUE_OK:
        CVar8 = curl_url_get(u,CURLUPART_URL,&local_b8[0].scheme,0);
        switch(CVar8) {
        case CURLUE_OK:
          uVar29 = *(uint *)&(data->state).field_0x6d0;
          if ((uVar29 >> 0x11 & 1) != 0) {
            (*Curl_cfree)((data->state).url);
            uVar29 = *(uint *)&(data->state).field_0x6d0;
          }
          (data->state).url = local_b8[0].scheme;
          *(uint *)&(data->state).field_0x6d0 = uVar29 | 0x20000;
          goto LAB_00539519;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_00539671_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_00539671_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_00539671_caseD_8;
        }
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_00539671_caseD_5:
        CVar10 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_00539671_caseD_7:
        CVar10 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_00539671_caseD_8:
        CVar10 = CURLE_LOGIN_DENIED;
      }
      goto switchD_0053954b_caseD_1;
    }
LAB_00539519:
    puVar30 = &(data->state).up;
    CVar8 = curl_url_get(u,CURLUPART_SCHEME,&puVar30->scheme,0);
    CVar10 = CVar11;
    switch(CVar8) {
    case CURLUE_OK:
      ppcVar1 = &(data->state).up.hostname;
      local_f0 = puVar30;
      CVar8 = curl_url_get(u,CURLUPART_HOST,ppcVar1,0);
      if (CVar8 == CURLUE_OK) {
        pcVar16 = *ppcVar1;
        sVar17 = strlen(pcVar16);
        if (0xffff < sVar17) {
          Curl_failf(data,"Too long host name (maximum is %d)",0xffff);
          goto switchD_0053954b_caseD_1;
        }
      }
      else {
        iVar9 = Curl_strcasecompare("file",local_f0->scheme);
        if (iVar9 == 0) break;
        pcVar16 = *ppcVar1;
      }
      if (pcVar16 == (char *)0x0) {
        pcVar26 = (char *)0x0;
      }
      else {
        pcVar26 = pcVar16;
        if (*pcVar16 == '[') {
          puVar15 = &(conn->bits).field_0x5;
          *puVar15 = *puVar15 | 8;
          pcVar26 = pcVar16 + 1;
          sVar17 = strlen(pcVar26);
          pcVar16[sVar17] = '\0';
          zonefrom_url(u,data,conn);
        }
      }
      if (pcVar26 == (char *)0x0) {
        pcVar26 = "";
      }
      pcVar16 = (*Curl_cstrdup)(pcVar26);
      (conn->host).rawalloc = pcVar16;
      if (pcVar16 != (char *)0x0) {
        local_e0 = &(data->state).aptr.proxyuser;
        (conn->host).name = pcVar16;
        (conn->host).dispname = pcVar16;
        do {
          cVar5 = *pcVar16;
          if (cVar5 == '\0') goto LAB_005397c3;
          pcVar16 = pcVar16 + 1;
        } while (-1 < cVar5);
        Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
LAB_005397c3:
        uVar29 = *(uint *)&(conn->bits).field_0x4;
        if ((uVar29 >> 9 & 1) != 0) {
          pcVar16 = (conn->conn_to_host).name;
          (conn->conn_to_host).dispname = pcVar16;
          if (pcVar16 != (char *)0x0) {
            do {
              cVar5 = *pcVar16;
              if (cVar5 == '\0') goto LAB_00539808;
              pcVar16 = pcVar16 + 1;
            } while (-1 < cVar5);
            Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
            uVar29 = *(uint *)&(conn->bits).field_0x4;
          }
        }
LAB_00539808:
        if ((uVar29 & 1) != 0) {
          pcVar16 = (conn->http_proxy).host.name;
          (conn->http_proxy).host.dispname = pcVar16;
          if (pcVar16 != (char *)0x0) {
            do {
              cVar5 = *pcVar16;
              if (cVar5 == '\0') goto LAB_00539844;
              pcVar16 = pcVar16 + 1;
            } while (-1 < cVar5);
            Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
            uVar29 = *(uint *)&(conn->bits).field_0x4;
          }
        }
LAB_00539844:
        if ((uVar29 & 2) != 0) {
          pcVar16 = (conn->socks_proxy).host.name;
          (conn->socks_proxy).host.dispname = pcVar16;
          if (pcVar16 != (char *)0x0) {
            do {
              cVar5 = *pcVar16;
              if (cVar5 == '\0') goto LAB_00539879;
              pcVar16 = pcVar16 + 1;
            } while (-1 < cVar5);
            Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
          }
        }
LAB_00539879:
        pcVar16 = local_f0->scheme;
        pCVar18 = Curl_builtin_scheme(pcVar16,0xffffffffffffffff);
        if (((pCVar18 == (Curl_handler *)0x0) ||
            (((data->set).allowed_protocols & pCVar18->protocol) == 0)) ||
           ((((data->state).field_0x6d0 & 2) != 0 &&
            (((data->set).redir_protocols & pCVar18->protocol) == 0)))) {
          Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar16);
          goto switchD_0053954b_caseD_5;
        }
        conn->given = pCVar18;
        conn->handler = pCVar18;
        ppVar27 = (proxy_info *)&(data->state).aptr.passwd;
        if ((data->state).aptr.passwd == (char *)0x0) {
          ppcVar1 = &(data->state).up.password;
          local_e8 = ppVar27;
          CVar8 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar1,0);
          ppVar27 = local_e8;
          switch(CVar8) {
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0053954b_caseD_5;
          case CURLUE_URLDECODE:
          case CURLUE_UNKNOWN_PART:
          case CURLUE_NO_SCHEME:
          case CURLUE_NO_USER:
switchD_0053997d_caseD_6:
            CVar10 = CURLE_URL_MALFORMAT;
            goto switchD_0053954b_caseD_1;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_0053954b_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0053954b_caseD_8;
          case CURLUE_NO_PASSWORD:
            break;
          default:
            if (CVar8 != CURLUE_OK) goto switchD_0053997d_caseD_6;
            CVar10 = Curl_urldecode(*ppcVar1,0,&local_b8[0].scheme,(size_t *)0x0,
                                    ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
            ppVar27 = local_e8;
            if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
            conn->passwd = local_b8[0].scheme;
            CVar10 = Curl_setstropt((char **)local_e8,local_b8[0].scheme);
            if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
          }
        }
        if ((data->set).str[0x2a] == (char *)0x0) {
          ppcVar1 = &(data->state).up.user;
          local_e8 = ppVar27;
          CVar8 = curl_url_get(u,CURLUPART_USER,ppcVar1,0);
          CVar10 = CVar11;
          switch(CVar8) {
          case CURLUE_OK:
            CVar10 = Curl_urldecode(*ppcVar1,0,&local_b8[0].scheme,(size_t *)0x0,
                                    ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
            if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
            conn->user = local_b8[0].scheme;
            break;
          default:
            goto switchD_0053954b_caseD_1;
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0053954b_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_0053954b_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0053954b_caseD_8;
          case CURLUE_NO_USER:
            if ((local_e8->host).rawalloc == (char *)0x0) goto LAB_005398e5;
            local_b8[0].scheme = "";
          }
          CVar10 = Curl_setstropt(&(data->state).aptr.user,local_b8[0].scheme);
          if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
        }
LAB_005398e5:
        ppcVar1 = &(data->state).up.options;
        CVar8 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar1,0x40);
        CVar10 = CVar11;
        switch(CVar8) {
        case CURLUE_UNSUPPORTED_SCHEME:
switchD_0053954b_caseD_5:
          CVar10 = CURLE_UNSUPPORTED_PROTOCOL;
        case CURLUE_URLDECODE:
        case CURLUE_UNKNOWN_PART:
        case CURLUE_NO_SCHEME:
        case CURLUE_NO_USER:
        case CURLUE_NO_PASSWORD:
          goto switchD_0053954b_caseD_1;
        case CURLUE_OUT_OF_MEMORY:
          break;
        case CURLUE_USER_NOT_ALLOWED:
switchD_0053954b_caseD_8:
          CVar10 = CURLE_LOGIN_DENIED;
          goto switchD_0053954b_caseD_1;
        case CURLUE_NO_OPTIONS:
switchD_0053991d_caseD_d:
          CVar8 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
          switch(CVar8) {
          case CURLUE_OK:
            CVar8 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
            if (CVar8 == CURLUE_OK) {
              ulnum = strtoul((data->state).up.port,(char **)0x0,10);
              uVar7 = (data->set).use_port;
              if ((uVar7 == 0) || (((data->state).field_0x6d0 & 0x10) == 0)) {
                uVar7 = curlx_ultous(ulnum);
              }
              conn->remote_port = (uint)uVar7;
              conn->port = (uint)uVar7;
            }
            else {
              iVar9 = Curl_strcasecompare("file",local_f0->scheme);
              if (iVar9 == 0) break;
            }
            curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
            uVar29 = (data->set).scope_id;
            if (uVar29 != 0) {
              conn->scope_id = uVar29;
            }
            pcVar16 = (data->set).str[0x46];
            if (pcVar16 != (char *)0x0) {
              pcVar16 = (*Curl_cstrdup)(pcVar16);
              conn->sasl_authzid = pcVar16;
              if (pcVar16 == (char *)0x0) break;
            }
            pcVar16 = (data->set).str[0x40];
            if (pcVar16 != (char *)0x0) {
              pcVar16 = (*Curl_cstrdup)(pcVar16);
              conn->oauth_bearer = pcVar16;
              if (pcVar16 == (char *)0x0) break;
            }
            if (((conn->bits).field_0x4 & 4) == 0) {
LAB_00539bfa:
              pcVar16 = (data->set).str[0x15];
              if (pcVar16 == (char *)0x0) {
                local_100 = (char *)0x0;
              }
              else {
                local_100 = (*Curl_cstrdup)(pcVar16);
                if (local_100 == (char *)0x0) {
                  Curl_failf(data,"memory shortage");
                  CVar10 = CURLE_OUT_OF_MEMORY;
                  goto LAB_00539cf7;
                }
              }
              pcVar16 = (data->set).str[0x16];
              if (pcVar16 == (char *)0x0) {
                pcVar16 = (char *)0x0;
LAB_00539d02:
                if ((data->set).str[0x2f] == (char *)0x0) {
                  pcVar28 = "no_proxy";
                  pcVar26 = curl_getenv("no_proxy");
                  if (pcVar26 == (char *)0x0) {
                    pcVar28 = "NO_PROXY";
                    pcVar26 = curl_getenv("NO_PROXY");
                    if (pcVar26 == (char *)0x0) goto LAB_00539d0c;
                  }
                  Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar28,pcVar26);
                }
                else {
LAB_00539d0c:
                  pcVar26 = (char *)0x0;
                }
                pcVar28 = (data->set).str[0x2f];
                if (pcVar28 == (char *)0x0) {
                  pcVar28 = pcVar26;
                }
                _Var6 = Curl_check_noproxy((conn->host).name,pcVar28);
                if (_Var6) {
                  (*Curl_cfree)(local_100);
                  (*Curl_cfree)(pcVar16);
                  (*Curl_cfree)(pcVar26);
LAB_00539ffa:
                  uVar29 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffc;
                }
                else {
                  if (local_100 == (char *)0x0 && pcVar16 == (char *)0x0) {
                    pcVar16 = conn->handler->scheme;
                    puVar30 = local_b8;
                    cVar5 = *pcVar16;
                    local_f0 = puVar30;
                    while (cVar5 != '\0') {
                      pcVar16 = pcVar16 + 1;
                      cVar5 = Curl_raw_tolower(cVar5);
                      *(char *)&puVar30->scheme = cVar5;
                      puVar30 = (urlpieces *)((long)&puVar30->scheme + 1);
                      cVar5 = *pcVar16;
                    }
                    builtin_strncpy((char *)((long)&puVar30->scheme + 3),"oxy",4);
                    *(undefined4 *)&puVar30->scheme = 0x6f72705f;
                    local_100 = curl_getenv((char *)local_b8);
                    if (local_100 == (char *)0x0) {
                      local_f0 = local_b8;
                      iVar9 = Curl_strcasecompare("http_proxy",(char *)local_f0);
                      if (iVar9 == 0) {
                        Curl_strntoupper((char *)local_b8,(char *)local_b8,0x80);
                        local_100 = curl_getenv((char *)local_b8);
                        if (local_100 != (char *)0x0) goto LAB_00539edd;
                      }
                      local_f0 = (urlpieces *)0x72a723;
                      local_100 = curl_getenv("all_proxy");
                      if (local_100 != (char *)0x0) goto LAB_00539edd;
                      local_f0 = (urlpieces *)0x72a72d;
                      local_100 = curl_getenv("ALL_PROXY");
                      if (local_100 != (char *)0x0) goto LAB_00539edd;
                      local_100 = (char *)0x0;
                    }
                    else {
LAB_00539edd:
                      Curl_infof(data,"Uses proxy env variable %s == \'%s\'",local_f0,local_100);
                    }
                    pcVar16 = (char *)0x0;
                  }
                  (*Curl_cfree)(pcVar26);
                  if (local_100 == (char *)0x0) {
LAB_00539f37:
                    local_100 = (char *)0x0;
                  }
                  else if ((*local_100 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                    (*Curl_cfree)(local_100);
                    goto LAB_00539f37;
                  }
                  if (pcVar16 == (char *)0x0) {
LAB_00539f94:
                    if (local_100 == (char *)0x0) goto LAB_00539ffa;
                    local_f0 = (urlpieces *)
                               CONCAT44(local_f0._4_4_,(uint)(conn->http_proxy).proxytype);
                    pcVar16 = (char *)0x0;
                    local_e0 = (char **)0x0;
LAB_00539fc0:
                    local_e8 = &conn->http_proxy;
                    CVar10 = parse_proxy(data,conn,local_100,(curl_proxytype)local_f0);
                    (*Curl_cfree)(local_100);
                    if (CVar10 != CURLE_OK) {
                      local_100 = (char *)0x0;
                      goto LAB_0053a049;
                    }
                    if ((char)local_e0 != '\0') goto LAB_0053a4ff;
                  }
                  else {
                    if ((*pcVar16 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                      (*Curl_cfree)(pcVar16);
                      goto LAB_00539f94;
                    }
                    local_e8 = &conn->http_proxy;
                    local_f0 = (urlpieces *)
                               CONCAT44(local_f0._4_4_,(uint)(conn->http_proxy).proxytype);
                    local_e0 = (char **)0x1;
                    if (local_100 != (char *)0x0) goto LAB_00539fc0;
LAB_0053a4ff:
                    CVar10 = parse_proxy(data,conn,pcVar16,(curl_proxytype)local_f0);
                    (*Curl_cfree)(pcVar16);
                    if (CVar10 != CURLE_OK) goto LAB_00539cf7;
                  }
                  if ((local_e8->host).rawalloc == (char *)0x0) {
                    uVar29 = *(uint *)&(conn->bits).field_0x4 & 0xfffffff6;
                    *(uint *)&(conn->bits).field_0x4 = uVar29;
                    if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_0053a642;
                    if ((conn->socks_proxy).user == (char *)0x0) {
                      pcVar16 = (conn->socks_proxy).passwd;
                      (conn->socks_proxy).user = (conn->http_proxy).user;
                      (conn->http_proxy).user = (char *)0x0;
                      (*Curl_cfree)(pcVar16);
                      (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                      (conn->http_proxy).passwd = (char *)0x0;
                      uVar29 = *(uint *)&(conn->bits).field_0x4;
                    }
                  }
                  else {
                    uVar29 = *(uint *)&(conn->bits).field_0x4;
                    if ((conn->handler->protocol & 3) == 0) {
                      if (((conn->handler->flags & 0x800) == 0) || ((uVar29 & 8) != 0)) {
                        uVar29 = uVar29 | 8;
                      }
                      else {
                        conn->handler = &Curl_handler_http;
                      }
                    }
                    uVar29 = uVar29 | 1;
                    if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_0053a642:
                      uVar29 = uVar29 & 0xfffffffd;
                      goto LAB_0053a004;
                    }
                  }
                  uVar29 = uVar29 | 2;
                }
LAB_0053a004:
                uVar24 = 0x20;
                if ((uVar29 & 1) == 0) {
                  uVar24 = (uVar29 & 2) << 4;
                }
                *(uint *)&(conn->bits).field_0x4 = uVar29 & 0xffffffdf | uVar24;
                if (uVar24 == 0) {
                  *(uint *)&(conn->bits).field_0x4 = uVar29 & 0xffffffd0;
                  (conn->http_proxy).proxytype = '\0';
                }
                local_100 = (char *)0x0;
                pcVar16 = (char *)0x0;
                CVar10 = CURLE_OK;
              }
              else {
                pcVar16 = (*Curl_cstrdup)(pcVar16);
                if (pcVar16 != (char *)0x0) goto LAB_00539d02;
                pcVar16 = (char *)0x0;
                Curl_failf(data,"memory shortage");
                CVar10 = CURLE_OUT_OF_MEMORY;
              }
            }
            else {
              pcVar16 = (data->state).aptr.proxyuser;
              pcVar26 = (data->state).aptr.proxypasswd;
              if (pcVar16 == (char *)0x0) {
                pcVar16 = "";
              }
              if (pcVar26 == (char *)0x0) {
                pcVar26 = "";
              }
              ppcVar1 = &(conn->http_proxy).user;
              CVar10 = Curl_urldecode(pcVar16,0,ppcVar1,(size_t *)0x0,REJECT_ZERO);
              if ((CVar10 == CURLE_OK) &&
                 (CVar10 = Curl_setstropt(local_e0,*ppcVar1), CVar10 == CURLE_OK)) {
                ppcVar1 = &(conn->http_proxy).passwd;
                CVar10 = Curl_urldecode(pcVar26,0,ppcVar1,(size_t *)0x0,REJECT_ZERO);
                if ((CVar10 == CURLE_OK) &&
                   (CVar10 = Curl_setstropt(&(data->state).aptr.proxypasswd,*ppcVar1),
                   CVar10 == CURLE_OK)) goto LAB_00539bfa;
              }
LAB_00539cf7:
              local_100 = (char *)0x0;
              pcVar16 = (char *)0x0;
            }
LAB_0053a049:
            (*Curl_cfree)(pcVar16);
            (*Curl_cfree)(local_100);
            if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
            if (((conn->given->flags & 1) != 0) &&
               (uVar29 = *(uint *)&(conn->bits).field_0x4, (uVar29 & 1) != 0)) {
              *(uint *)&(conn->bits).field_0x4 = uVar29 | 8;
            }
            uVar7 = (data->set).use_port;
            if ((uVar7 != 0) && (((data->state).field_0x6d0 & 0x10) != 0)) {
              conn->remote_port = (uint)uVar7;
              curl_msnprintf((char *)local_b8,0x10,"%d");
              CVar8 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_b8,0);
              if (CVar8 != CURLUE_OK) break;
            }
            CVar10 = override_login(data,conn);
            if (((CVar10 != CURLE_OK) || (CVar10 = set_login(data,conn), CVar10 != CURLE_OK)) ||
               (CVar10 = parse_connect_to_slist(data,conn,(data->set).connect_to),
               CVar10 != CURLE_OK)) goto switchD_0053954b_caseD_1;
            uVar29 = *(uint *)&(conn->bits).field_0x4;
            if ((uVar29 >> 9 & 1) != 0) {
              iVar9 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name);
              uVar29 = *(uint *)&(conn->bits).field_0x4;
              if (iVar9 != 0) {
                uVar29 = uVar29 & 0xfffffdff;
                *(uint *)&(conn->bits).field_0x4 = uVar29;
              }
            }
            if (((uVar29 >> 10 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
              uVar29 = uVar29 & 0xfffffbff;
              *(uint *)&(conn->bits).field_0x4 = uVar29;
            }
            if ((uVar29 & 1) != 0 && (uVar29 & 0x600) != 0) {
              *(uint *)&(conn->bits).field_0x4 = uVar29 | 8;
            }
            pCVar18 = conn->handler;
            if (pCVar18->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
              CVar10 = (*pCVar18->setup_connection)(data,conn);
              if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
              pCVar18 = conn->handler;
            }
            if (conn->port < 0) {
              conn->port = pCVar18->defport;
            }
            conn->recv[0] = Curl_recv_plain;
            conn->send[0] = Curl_send_plain;
            conn->recv[1] = Curl_recv_plain;
            conn->send[1] = Curl_send_plain;
            *(uint *)&(conn->bits).field_0x4 =
                 *(uint *)&(conn->bits).field_0x4 & 0xfdffffff |
                 (uint)(*(ulong *)&(data->set).field_0x8e2 >> 0xe) & 0x2000000;
            if ((pCVar18->flags & 0x10) == 0) {
              pcVar16 = (data->set).str[0x1c];
              (data->set).ssl.primary.CApath = (data->set).str[0x1a];
              (data->set).ssl.primary.CAfile = pcVar16;
              (data->set).ssl.primary.issuercert = (data->set).str[0x27];
              (data->set).ssl.primary.issuercert_blob = (data->set).blobs[4];
              (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
              (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
              (data->set).ssl.primary.pinned_key = (data->set).str[0x1e];
              (data->set).ssl.primary.cert_blob = (data->set).blobs[0];
              (data->set).ssl.primary.ca_info_blob = (data->set).blobs[6];
              (data->set).ssl.primary.curves = (data->set).str[0x4b];
              pcVar16 = (data->set).str[0x1d];
              (data->set).proxy_ssl.primary.CApath = (data->set).str[0x1b];
              (data->set).proxy_ssl.primary.CAfile = pcVar16;
              (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
              (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
              (data->set).proxy_ssl.primary.pinned_key = (data->set).str[0x1f];
              (data->set).proxy_ssl.primary.cert_blob = (data->set).blobs[1];
              (data->set).proxy_ssl.primary.ca_info_blob = (data->set).blobs[7];
              (data->set).proxy_ssl.primary.issuercert = (data->set).str[0x28];
              (data->set).proxy_ssl.primary.issuercert_blob = (data->set).blobs[5];
              (data->set).proxy_ssl.primary.CRLfile = (data->set).str[0x26];
              (data->set).proxy_ssl.cert_type = (data->set).str[3];
              (data->set).proxy_ssl.key = (data->set).str[0xe];
              (data->set).proxy_ssl.key_type = (data->set).str[0x12];
              (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
              pcVar16 = (data->set).str[2];
              (data->set).proxy_ssl.primary.clientcert = (data->set).str[1];
              (data->set).proxy_ssl.key_blob = (data->set).blobs[3];
              (data->set).ssl.primary.CRLfile = (data->set).str[0x25];
              (data->set).ssl.cert_type = pcVar16;
              (data->set).ssl.key = (data->set).str[0xd];
              (data->set).ssl.key_type = (data->set).str[0x11];
              (data->set).ssl.key_passwd = (data->set).str[0xf];
              (data->set).ssl.primary.clientcert = (data->set).str[0];
              (data->set).ssl.key_blob = (data->set).blobs[2];
              _Var6 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&conn->ssl_config);
              if ((!_Var6) ||
                 (_Var6 = Curl_clone_primary_ssl_config
                                    (&(data->set).proxy_ssl.primary,&conn->proxy_ssl_config), !_Var6
                 )) break;
              prune_dead_connections(data);
              if (((((data->set).field_0x8e5 & 0x40) == 0) || (((data->state).field_0x6d0 & 2) != 0)
                  ) && (((data->set).connect_only == '\0' &&
                        (_Var6 = ConnectionExists(data,conn,&local_c0,&local_f1,&local_f2),
                        pcVar20 = local_c0, _Var6)))) {
                reuse_conn(data,conn,local_c0);
                pcVar16 = "proxy";
                if (((pcVar20->bits).field_0x4 & 0x20) == 0) {
                  pcVar16 = "host";
                }
                lVar19 = 0xf0;
                if (((pcVar20->socks_proxy).host.name == (char *)0x0) &&
                   (lVar19 = 0x130, (pcVar20->http_proxy).host.name == (char *)0x0)) {
                  lVar19 = 0xa0;
                }
                Curl_infof(data,"Re-using existing connection #%ld with %s %s",
                           pcVar20->connection_id,pcVar16,
                           *(undefined8 *)((pcVar20->chunk).hexbuffer + lVar19 + -0x3d));
                conn = pcVar20;
              }
              else {
                if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8e7 & 1) != 0)) {
                  puVar15 = &(conn->bits).field_0x7;
                  *puVar15 = *puVar15 | 4;
                }
                if (local_f2 != false) {
LAB_0053a6c2:
                  Curl_infof(data,"No connections available.");
                  conn_free(conn);
                  CVar10 = CURLE_NO_CONNECTION_AVAILABLE;
                  conn = (connectdata *)0x0;
                  goto switchD_0053954b_caseD_1;
                }
                bundle = Curl_conncache_find_bundle(data,conn,(data->state).conn_cache);
                if ((bundle == (connectbundle *)0x0 || local_d8 == 0) ||
                   (bundle->num_connections < local_d8)) {
                  if (data->share != (Curl_share *)0x0) {
                    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
                  }
                }
                else {
                  pcVar20 = Curl_conncache_extract_bundle(data,bundle);
                  if (data->share != (Curl_share *)0x0) {
                    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
                  }
                  if (pcVar20 == (connectdata *)0x0) {
                    Curl_infof(data,"No more connections allowed to host: %zu",local_d8);
                    goto LAB_0053a6c2;
                  }
                  Curl_disconnect(data,pcVar20,false);
                }
                if ((local_c8 != 0) && (sVar12 = Curl_conncache_size(data), local_c8 <= sVar12)) {
                  pcVar20 = Curl_conncache_extract_oldest(data);
                  if (pcVar20 == (connectdata *)0x0) {
                    Curl_infof(data,"No connections available in cache");
                    goto LAB_0053a6c2;
                  }
                  Curl_disconnect(data,pcVar20,false);
                }
                Curl_attach_connection(data,conn);
                CVar10 = Curl_conncache_add_conn(data);
                if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
                if ((((data->state).authhost.picked & 0x28) != 0) &&
                   (((data->state).authhost.field_0x18 & 1) != 0)) {
                  Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                  (data->state).authhost.picked = 0;
                  puVar15 = &(data->state).authhost.field_0x18;
                  *puVar15 = *puVar15 & 0xfe;
                }
                if ((((data->state).authproxy.picked & 0x28) != 0) &&
                   (((data->state).authproxy.field_0x18 & 1) != 0)) {
                  Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                  (data->state).authproxy.picked = 0;
                  puVar15 = &(data->state).authproxy.field_0x18;
                  *puVar15 = *puVar15 & 0xfe;
                }
              }
              Curl_init_do(data,conn);
              CVar10 = setup_range(data);
              if (CVar10 != CURLE_OK) goto switchD_0053954b_caseD_1;
              conn->seek_func = (data->set).seek_func;
              conn->seek_client = (data->set).seek_client;
              CVar10 = resolve_server(data,conn,asyncp);
            }
            else {
              Curl_persistconninfo(data,conn,(char *)0x0,-1);
              CVar11 = (*conn->handler->connect_it)(data,(_Bool *)local_b8);
              if (CVar11 == CURLE_OK) {
                (conn->bits).tcpconnect[0] = true;
                Curl_attach_connection(data,conn);
                CVar10 = Curl_conncache_add_conn(data);
                if (CVar10 == CURLE_OK) {
                  CVar10 = setup_range(data);
                  if (CVar10 == CURLE_OK) {
                    Curl_setup_transfer(data,-1,-1,false,-1);
                    goto LAB_0053a617;
                  }
                  (*conn->handler->done)(data,CVar10,false);
                }
              }
              else {
LAB_0053a617:
                Curl_init_do(data,conn);
                CVar10 = CVar11;
              }
            }
            if (CVar10 == CURLE_OK) {
              if (1 < (conn->easyq).size) {
                *local_d0 = true;
                return CURLE_OK;
              }
              if (*asyncp != false) {
                return CURLE_OK;
              }
              CVar10 = Curl_setup_conn(data,local_d0);
            }
          default:
            goto switchD_0053954b_caseD_1;
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0053954b_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            break;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0053954b_caseD_8;
          }
        default:
          if (CVar8 != CURLUE_OK) goto switchD_0053954b_caseD_1;
          pcVar16 = (*Curl_cstrdup)(*ppcVar1);
          conn->options = pcVar16;
          if (pcVar16 != (char *)0x0) goto switchD_0053991d_caseD_d;
        }
      }
      break;
    default:
      goto switchD_0053954b_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0053954b_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      break;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0053954b_caseD_8;
    }
  }
switchD_0053954b_caseD_7:
  CVar10 = CURLE_OUT_OF_MEMORY;
switchD_0053954b_caseD_1:
  CVar11 = CURLE_NO_CONNECTION_AVAILABLE;
  if (((CVar10 != CURLE_NO_CONNECTION_AVAILABLE) && (CVar11 = CVar10, conn != (connectdata *)0x0))
     && (CVar10 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data,conn,true);
    Curl_disconnect(data,conn,true);
  }
  return CVar11;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.size = data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }

  return result;
}